

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O0

int CfdInitializeFundRawTx
              (void *handle,int network_type,uint32_t target_asset_count,char *fee_asset,
              void **fund_handle)

{
  bool bVar1;
  NetType size;
  int iVar2;
  undefined8 uVar3;
  ulong uVar4;
  uchar *__src;
  undefined8 *puVar5;
  void *pvVar6;
  char *in_RCX;
  uint in_EDX;
  undefined8 *in_R8;
  CfdException *except;
  exception *std_except;
  uint8_t empty_asset [33];
  ConfidentialAssetId asset_data;
  string asset_hex;
  bool is_bitcoin;
  CfdCapiFundRawTxData obj;
  CfdCapiFundRawTxData *buffer;
  int result;
  string *in_stack_fffffffffffffc70;
  undefined8 in_stack_fffffffffffffc78;
  CfdError error_code;
  CfdException *in_stack_fffffffffffffc80;
  vector<cfd::capi::CfdCapiFundTargetAmount,_std::allocator<cfd::capi::CfdCapiFundTargetAmount>_>
  *this;
  bool *in_stack_fffffffffffffcb8;
  undefined8 in_stack_fffffffffffffcc0;
  string *in_stack_fffffffffffffd20;
  undefined1 local_2aa [2];
  string local_2a8 [38];
  undefined1 local_282;
  allocator local_281;
  string local_280 [32];
  CfdSourceLocation local_260;
  undefined1 local_242;
  allocator local_241;
  string local_240 [32];
  CfdSourceLocation local_220;
  undefined1 local_208 [40];
  ByteData local_1e0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_1c8;
  ConfidentialAssetId local_1b0;
  allocator local_181;
  string local_180;
  byte local_159;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  ulong uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined1 local_c2;
  allocator local_c1;
  string local_c0 [32];
  CfdSourceLocation local_a0;
  undefined1 local_82;
  allocator local_81;
  string local_80 [32];
  CfdSourceLocation local_60;
  undefined8 *local_38;
  undefined4 local_2c;
  undefined8 *local_28;
  char *local_20;
  uint local_18;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffc78 >> 0x20);
  iVar2 = (int)((ulong)in_stack_fffffffffffffcc0 >> 0x20);
  local_2c = 0xffffffff;
  local_38 = (undefined8 *)0x0;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_EDX;
  cfd::Initialize();
  if (local_28 == (undefined8 *)0x0) {
    local_60.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_transaction.cpp"
                 ,0x2f);
    local_60.filename = local_60.filename + 1;
    local_60.line = 0xb43;
    local_60.funcname = "CfdInitializeFundRawTx";
    cfd::core::logger::warn<>(&local_60,"fund handle is null.");
    local_82 = 1;
    uVar3 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_80,"Failed to parameter. fund handle is null.",&local_81);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffc80,error_code,in_stack_fffffffffffffc70);
    local_82 = 0;
    __cxa_throw(uVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (local_18 == 0) {
    local_a0.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_transaction.cpp"
                 ,0x2f);
    local_a0.filename = local_a0.filename + 1;
    local_a0.line = 0xb49;
    local_a0.funcname = "CfdInitializeFundRawTx";
    cfd::core::logger::warn<>(&local_a0,"target_asset_count is zero.");
    local_c2 = 1;
    uVar3 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_c0,"Failed to parameter. target_asset_count is null.",&local_c1);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffc80,error_code,in_stack_fffffffffffffc70);
    local_c2 = 0;
    __cxa_throw(uVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_d8 = 0;
  uStack_d0 = 0;
  local_e8 = 0;
  uStack_e0 = 0;
  local_f8 = 0;
  uStack_f0 = 0;
  local_108 = 0;
  uStack_100 = 0;
  local_118 = 0;
  uStack_110 = 0;
  local_128 = 0;
  uStack_120 = 0;
  local_138 = 0;
  uStack_130 = 0;
  local_148 = 0;
  uStack_140 = 0;
  local_158 = 0;
  uStack_150 = 0;
  local_159 = 0;
  size = cfd::capi::ConvertNetType(iVar2,in_stack_fffffffffffffcb8);
  local_148 = CONCAT44(local_148._4_4_,size);
  bVar1 = cfd::capi::IsEmptyString(local_20);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_180,local_20,&local_181);
    std::allocator<char>::~allocator((allocator<char> *)&local_181);
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_1b0,&local_180);
      cfd::core::ConfidentialAssetId::GetData(&local_1e0,&local_1b0);
      cfd::core::ByteData::GetBytes(&local_1c8,&local_1e0);
      __src = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x6249c4);
      memcpy((void *)((long)&local_148 + 4),__src,0x21);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffc70)
      ;
      cfd::core::ByteData::~ByteData((ByteData *)0x6249f3);
      memset(local_208,0,0x21);
      iVar2 = memcmp((void *)((long)&local_148 + 4),local_208,0x21);
      if (iVar2 != 0) {
        local_128._0_6_ = CONCAT15(1,(undefined5)local_128);
        if ((local_159 & 1) != 0) {
          local_220.filename =
               strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_transaction.cpp"
                       ,0x2f);
          local_220.filename = local_220.filename + 1;
          local_220.line = 0xb5f;
          local_220.funcname = "CfdInitializeFundRawTx";
          cfd::core::logger::warn<>(&local_220,"network type is not elements.");
          local_242 = 1;
          uVar3 = __cxa_allocate_exception(0x30);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_240,"Failed to parameter. network type is not elements.",&local_241);
          cfd::core::CfdException::CfdException
                    (in_stack_fffffffffffffc80,error_code,in_stack_fffffffffffffc70);
          local_242 = 0;
          __cxa_throw(uVar3,&cfd::core::CfdException::typeinfo,
                      cfd::core::CfdException::~CfdException);
        }
      }
      cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x624c0a);
    }
    std::__cxx11::string::~string((string *)&local_180);
  }
  if ((local_128._5_1_ & 1) != (local_159 & 1)) {
    uStack_f0 = uStack_f0 & 0xffffffffffffff00;
    uStack_e0 = 0x3fc3333333333333;
    if ((local_128 & 0x10000000000) == 0) {
      uStack_e0 = 0x4034000000000000;
    }
    local_e8 = 0x4008000000000000;
    local_d8 = 0xffffffffffffffff;
    uStack_d0 = 0x2400000000;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2a8,"FundRawTxData",(allocator *)(local_2aa + 1));
    local_38 = (undefined8 *)cfd::capi::AllocBuffer(in_stack_fffffffffffffd20,size);
    std::__cxx11::string::~string(local_2a8);
    std::allocator<char>::~allocator((allocator<char> *)(local_2aa + 1));
    local_158 = *local_38;
    uStack_150 = local_38[1];
    memcpy(local_38,&local_158,0x90);
    puVar5 = (undefined8 *)operator_new(0x18);
    *puVar5 = 0;
    puVar5[1] = 0;
    puVar5[2] = 0;
    std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::vector
              ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)0x624ecb);
    local_38[7] = puVar5;
    puVar5 = (undefined8 *)operator_new(0x18);
    *puVar5 = 0;
    puVar5[1] = 0;
    puVar5[2] = 0;
    std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::vector
              ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)0x624f05);
    local_38[8] = puVar5;
    puVar5 = (undefined8 *)operator_new(0x18);
    *puVar5 = 0;
    puVar5[1] = 0;
    puVar5[2] = 0;
    std::vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>::
    vector((vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
            *)0x624f3f);
    local_38[9] = puVar5;
    pvVar6 = operator_new(0x18);
    uVar4 = (ulong)local_18;
    this = (vector<cfd::capi::CfdCapiFundTargetAmount,_std::allocator<cfd::capi::CfdCapiFundTargetAmount>_>
            *)local_2aa;
    std::allocator<cfd::capi::CfdCapiFundTargetAmount>::allocator
              ((allocator<cfd::capi::CfdCapiFundTargetAmount> *)0x624f87);
    std::
    vector<cfd::capi::CfdCapiFundTargetAmount,_std::allocator<cfd::capi::CfdCapiFundTargetAmount>_>
    ::vector(this,uVar4,(allocator_type *)in_stack_fffffffffffffc70);
    local_38[0xb] = pvVar6;
    std::allocator<cfd::capi::CfdCapiFundTargetAmount>::~allocator
              ((allocator<cfd::capi::CfdCapiFundTargetAmount> *)0x624fc3);
    pvVar6 = operator_new(0x18);
    memset(pvVar6,0,0x18);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x624fef);
    local_38[10] = pvVar6;
    *local_28 = local_38;
    return 0;
  }
  local_260.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_transaction.cpp"
               ,0x2f);
  local_260.filename = local_260.filename + 1;
  local_260.line = 0xb6b;
  local_260.funcname = "CfdInitializeFundRawTx";
  cfd::core::logger::warn<>(&local_260,"network type not is bitcoin.");
  local_282 = 1;
  uVar3 = __cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_280,"Failed to parameter. network type is not bitcoin.",&local_281);
  cfd::core::CfdException::CfdException
            (in_stack_fffffffffffffc80,error_code,in_stack_fffffffffffffc70);
  local_282 = 0;
  __cxa_throw(uVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdInitializeFundRawTx(
    void* handle, int network_type, uint32_t target_asset_count,
    const char* fee_asset, void** fund_handle) {
  int result = CfdErrorCode::kCfdUnknownError;
  CfdCapiFundRawTxData* buffer = nullptr;
  try {
    cfd::Initialize();
    if (fund_handle == nullptr) {
      warn(CFD_LOG_SOURCE, "fund handle is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. fund handle is null.");
    }
    if (target_asset_count == 0) {
      warn(CFD_LOG_SOURCE, "target_asset_count is zero.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. target_asset_count is null.");
    }
    CfdCapiFundRawTxData obj;
    memset(&obj, 0, sizeof(obj));
    bool is_bitcoin = false;
    obj.net_type = ConvertNetType(network_type, &is_bitcoin);
    if (!IsEmptyString(fee_asset)) {
#ifndef CFD_DISABLE_ELEMENTS
      std::string asset_hex(fee_asset);
      if (!asset_hex.empty()) {
        ConfidentialAssetId asset_data(asset_hex);
        memcpy(
            obj.fee_asset, asset_data.GetData().GetBytes().data(),
            sizeof(obj.fee_asset));
        uint8_t empty_asset[kAssetSize];
        memset(empty_asset, 0, sizeof(empty_asset));
        if (memcmp(obj.fee_asset, empty_asset, sizeof(empty_asset)) != 0) {
          obj.is_elements = true;
          if (is_bitcoin) {
            warn(CFD_LOG_SOURCE, "network type is not elements.");
            throw CfdException(
                CfdError::kCfdIllegalArgumentError,
                "Failed to parameter. network type is not elements.");
          }
        }
      }
#else
      info(CFD_LOG_SOURCE, "unuse asset[{}]", fee_asset);
#endif  // CFD_DISABLE_ELEMENTS
    }
    if (obj.is_elements == is_bitcoin) {
      warn(CFD_LOG_SOURCE, "network type not is bitcoin.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. network type is not bitcoin.");
    }
    obj.is_blind = false;
    obj.long_term_fee_rate = (obj.is_elements) ? 0.15 : 20.0;
    obj.dust_fee_rate = 3.0;
    obj.knapsack_min_change = -1;
    obj.exponent = 0;
    obj.minimum_bits = cfd::capi::kMinimumBits;  // = 36(old)

    buffer = static_cast<CfdCapiFundRawTxData*>(
        AllocBuffer(kPrefixFundRawTxData, sizeof(CfdCapiFundRawTxData)));
    memcpy(obj.prefix, buffer->prefix, sizeof(obj.prefix));
    *buffer = obj;
    buffer->utxos = new std::vector<UtxoData>();
    buffer->input_utxos = new std::vector<UtxoData>();
#ifndef CFD_DISABLE_ELEMENTS
    buffer->input_elements_utxos = new std::vector<ElementsUtxoAndOption>();
#endif  // CFD_DISABLE_ELEMENTS
    buffer->targets =
        new std::vector<CfdCapiFundTargetAmount>(target_asset_count);
    buffer->append_txout_addresses = new std::vector<std::string>();
    *fund_handle = buffer;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  if (buffer != nullptr) CfdFreeFundRawTxHandle(handle, buffer);
  return result;
}